

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

HTS_Boolean HTS_Window_load(HTS_Window *win,HTS_File **fp,size_t size)

{
  HTS_Boolean HVar1;
  int iVar2;
  void *pvVar3;
  ulong in_RDX;
  long in_RSI;
  ulong *in_RDI;
  double dVar4;
  HTS_Boolean result;
  char buff [1024];
  size_t length;
  size_t fsize;
  size_t j;
  size_t i;
  uint7 in_stack_fffffffffffffbb0;
  char cVar5;
  size_t in_stack_fffffffffffffbb8;
  char *in_stack_fffffffffffffbc0;
  HTS_File *in_stack_fffffffffffffbc8;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  HTS_Boolean local_1;
  
  cVar5 = '\x01';
  if (((in_RDI == (ulong *)0x0) || (in_RSI == 0)) || (in_RDX == 0)) {
    local_1 = '\0';
  }
  else {
    *in_RDI = in_RDX;
    pvVar3 = HTS_calloc(in_stack_fffffffffffffbb8,CONCAT17(1,in_stack_fffffffffffffbb0));
    in_RDI[1] = (ulong)pvVar3;
    pvVar3 = HTS_calloc(in_stack_fffffffffffffbb8,CONCAT17(cVar5,in_stack_fffffffffffffbb0));
    in_RDI[2] = (ulong)pvVar3;
    pvVar3 = HTS_calloc(in_stack_fffffffffffffbb8,CONCAT17(cVar5,in_stack_fffffffffffffbb0));
    in_RDI[3] = (ulong)pvVar3;
    for (local_28 = 0; local_28 < *in_RDI; local_28 = local_28 + 1) {
      HVar1 = HTS_get_token_from_fp(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
      if (HVar1 == '\0') {
        cVar5 = '\0';
        local_38 = 1;
      }
      else {
        iVar2 = atoi(&stack0xfffffffffffffbb8);
        local_38 = (ulong)iVar2;
        if (local_38 == 0) {
          cVar5 = '\0';
          local_38 = 1;
        }
      }
      pvVar3 = HTS_calloc(in_stack_fffffffffffffbb8,CONCAT17(cVar5,in_stack_fffffffffffffbb0));
      *(void **)(in_RDI[3] + local_28 * 8) = pvVar3;
      for (local_30 = 0; local_30 < local_38; local_30 = local_30 + 1) {
        HVar1 = HTS_get_token_from_fp(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
        if (HVar1 == '\0') {
          cVar5 = '\0';
          *(undefined8 *)(*(long *)(in_RDI[3] + local_28 * 8) + local_30 * 8) = 0;
        }
        else {
          dVar4 = atof(&stack0xfffffffffffffbb8);
          *(double *)(*(long *)(in_RDI[3] + local_28 * 8) + local_30 * 8) = dVar4;
        }
      }
      *(ulong *)(in_RDI[3] + local_28 * 8) =
           (local_38 >> 1) * 8 + *(long *)(in_RDI[3] + local_28 * 8);
      iVar2 = (int)(local_38 >> 1);
      *(int *)(in_RDI[1] + local_28 * 4) = -iVar2;
      *(int *)(in_RDI[2] + local_28 * 4) = iVar2;
      if ((local_38 & 1) == 0) {
        *(int *)(in_RDI[2] + local_28 * 4) = *(int *)(in_RDI[2] + local_28 * 4) + -1;
      }
    }
    in_RDI[4] = 0;
    for (local_28 = 0; local_28 < *in_RDI; local_28 = local_28 + 1) {
      iVar2 = *(int *)(in_RDI[1] + local_28 * 4);
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      if (in_RDI[4] < (ulong)(long)iVar2) {
        iVar2 = *(int *)(in_RDI[1] + local_28 * 4);
        if (iVar2 < 1) {
          iVar2 = -iVar2;
        }
        in_RDI[4] = (long)iVar2;
      }
      iVar2 = *(int *)(in_RDI[2] + local_28 * 4);
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      if (in_RDI[4] < (ulong)(long)iVar2) {
        iVar2 = *(int *)(in_RDI[2] + local_28 * 4);
        if (iVar2 < 1) {
          iVar2 = -iVar2;
        }
        in_RDI[4] = (long)iVar2;
      }
    }
    if (cVar5 == '\0') {
      HTS_Window_clear((HTS_Window *)(ulong)in_stack_fffffffffffffbb0);
      local_1 = '\0';
    }
    else {
      local_1 = '\x01';
    }
  }
  return local_1;
}

Assistant:

static HTS_Boolean HTS_Window_load(HTS_Window * win, HTS_File ** fp, size_t size)
{
   size_t i, j;
   size_t fsize, length;
   char buff[HTS_MAXBUFLEN];
   HTS_Boolean result = TRUE;

   /* check */
   if (win == NULL || fp == NULL || size == 0)
      return FALSE;

   win->size = size;
   win->l_width = (int *) HTS_calloc(win->size, sizeof(int));
   win->r_width = (int *) HTS_calloc(win->size, sizeof(int));
   win->coefficient = (double **) HTS_calloc(win->size, sizeof(double *));
   /* set delta coefficents */
   for (i = 0; i < win->size; i++) {
      if (HTS_get_token_from_fp(fp[i], buff) == FALSE) {
         result = FALSE;
         fsize = 1;
      } else {
         fsize = atoi(buff);
         if (fsize == 0) {
            result = FALSE;
            fsize = 1;
         }
      }
      /* read coefficients */
      win->coefficient[i] = (double *) HTS_calloc(fsize, sizeof(double));
      for (j = 0; j < fsize; j++) {
         if (HTS_get_token_from_fp(fp[i], buff) == FALSE) {
            result = FALSE;
            win->coefficient[i][j] = 0.0;
         } else {
            win->coefficient[i][j] = (double) atof(buff);
         }
      }
      /* set pointer */
      length = fsize / 2;
      win->coefficient[i] += length;
      win->l_width[i] = -1 * (int) length;
      win->r_width[i] = (int) length;
      if (fsize % 2 == 0)
         win->r_width[i]--;
   }
   /* calcurate max_width to determine size of band matrix */
   win->max_width = 0;
   for (i = 0; i < win->size; i++) {
      if (win->max_width < (size_t) abs(win->l_width[i]))
         win->max_width = abs(win->l_width[i]);
      if (win->max_width < (size_t) abs(win->r_width[i]))
         win->max_width = abs(win->r_width[i]);
   }

   if (result == FALSE) {
      HTS_Window_clear(win);
      return FALSE;
   }
   return TRUE;
}